

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

string * __thiscall
glcts::TestCaseBase::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,GLuint shader_id)

{
  pointer pcVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar4;
  char *pcVar5;
  vector<char,_std::allocator<char>_> result_vec;
  GLint length;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  int local_2c;
  long lVar3;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_2c = 0;
  (**(code **)(lVar3 + 0xa70))(shader_id,0x8b88,&local_2c);
  std::vector<char,_std::allocator<char>_>::vector(&local_48,(long)(local_2c + 1),&local_49);
  (**(code **)(lVar3 + 0xa68))
            (shader_id,local_2c + 1,0,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Could not retrieve shader source!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x332);
  pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar5 = &DAT_00000001;
  }
  else {
    sVar4 = strlen(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar5 = pcVar1 + sVar4;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar5);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getShaderSource(glw::GLuint shader_id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint length = 0;

	gl.getShaderiv(shader_id, GL_SHADER_SOURCE_LENGTH, &length);

	std::vector<char> result_vec(length + 1);

	gl.getShaderSource(shader_id, length + 1, NULL, &result_vec[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve shader source!");

	return std::string(&result_vec[0]);
}